

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::internal::ExtensionSet::_InternalSerializeAllImpl
          (ExtensionSet *this,MessageLite *extendee,uint8_t *target,EpsCopyOutputStream *stream)

{
  KeyValue *pKVar1;
  MessageLite *pMVar2;
  EpsCopyOutputStream *pEVar3;
  MessageLite *extendee_00;
  EpsCopyOutputStream *stream_00;
  KeyValue *pKVar4;
  KeyValue *pKVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  bool bVar9;
  uint8_t *local_68;
  MessageLite *local_60;
  EpsCopyOutputStream *local_58;
  undefined1 *local_50;
  MessageLite *local_48;
  EpsCopyOutputStream *local_40;
  ExtensionSet *local_38;
  
  local_50 = (undefined1 *)&local_68;
  lVar6 = (long)(short)this->flat_size_;
  pKVar5 = (this->map_).flat;
  local_68 = target;
  local_48 = extendee;
  local_40 = stream;
  local_38 = this;
  if (lVar6 < 0) {
    _InternalSerializeAllImpl();
  }
  else {
    lVar7 = lVar6 * 0x20;
    pKVar1 = pKVar5 + lVar6;
    pKVar4 = pKVar5;
    pMVar2 = extendee;
    pEVar3 = stream;
    local_50 = (undefined1 *)&local_68;
    local_58 = stream;
    local_60 = extendee;
    if (this->flat_size_ != 0) {
      uVar8 = 0;
      local_50 = (undefined1 *)&local_68;
      do {
        lVar7 = lVar7 + -0x20;
        Extension::PrefetchPtr(&pKVar4->second);
        pKVar4 = pKVar4 + 1;
        pMVar2 = local_60;
        pEVar3 = local_58;
        if (lVar7 == 0) break;
        bVar9 = uVar8 < 0xf;
        uVar8 = uVar8 + 1;
      } while (bVar9);
    }
    for (; stream_00 = local_58, extendee_00 = local_60, local_60 = pMVar2, local_58 = pEVar3,
        pKVar4 != pKVar1; pKVar4 = pKVar4 + 1) {
      local_68 = Extension::InternalSerializeFieldWithCachedSizesToArray
                           (&pKVar5->second,extendee_00,this,pKVar5->first,local_68,stream_00);
      Extension::PrefetchPtr(&pKVar4->second);
      pKVar5 = pKVar5 + 1;
      pMVar2 = local_60;
      pEVar3 = local_58;
      local_58 = stream_00;
      local_60 = extendee_00;
    }
    for (; pKVar5 != pKVar1; pKVar5 = pKVar5 + 1) {
      local_68 = Extension::InternalSerializeFieldWithCachedSizesToArray
                           (&pKVar5->second,extendee_00,this,pKVar5->first,local_68,stream_00);
    }
  }
  return local_68;
}

Assistant:

uint8_t* ExtensionSet::_InternalSerializeAllImpl(
    const MessageLite* extendee, uint8_t* target,
    io::EpsCopyOutputStream* stream) const {
  ForEach(
      [&target, extendee, stream, this](int number, const Extension& ext) {
        target = ext.InternalSerializeFieldWithCachedSizesToArray(
            extendee, this, number, target, stream);
      },
      Prefetch{});
  return target;
}